

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O3

char * __thiscall CppUnit::Exception::what(Exception *this)

{
  long *plVar1;
  pointer pcVar2;
  string *psVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  string local_88;
  long *local_68;
  undefined8 local_60;
  long local_58;
  undefined8 uStack_50;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  psVar3 = Message::shortDescription_abi_cxx11_(&this->m_message);
  pcVar2 = (psVar3->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + psVar3->_M_string_length);
  std::__cxx11::string::append((char *)&local_48);
  Message::details_abi_cxx11_(&local_88,&this->m_message);
  uVar5 = 0xf;
  if (local_48 != local_38) {
    uVar5 = local_38[0];
  }
  if (uVar5 < local_88._M_string_length + local_40) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar6 = local_88.field_2._M_allocated_capacity;
    }
    if (local_88._M_string_length + local_40 <= (ulong)uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_48);
      goto LAB_001221bc;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_88._M_dataplus._M_p);
LAB_001221bc:
  local_68 = &local_58;
  plVar1 = puVar4 + 2;
  if ((long *)*puVar4 == plVar1) {
    local_58 = *plVar1;
    uStack_50 = puVar4[3];
  }
  else {
    local_58 = *plVar1;
    local_68 = (long *)*puVar4;
  }
  local_60 = puVar4[1];
  *puVar4 = plVar1;
  puVar4[1] = 0;
  *(undefined1 *)plVar1 = 0;
  std::__cxx11::string::operator=((string *)&this->m_whatMessage,(string *)&local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return (this->m_whatMessage)._M_dataplus._M_p;
}

Assistant:

const char*
Exception::what() const throw()
{
  Exception *mutableThis = CPPUNIT_CONST_CAST( Exception *, this );
  mutableThis->m_whatMessage = m_message.shortDescription() + "\n" + 
                               m_message.details();
  return m_whatMessage.c_str();
}